

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O3

int Gia_ManEquivCountOne(Gia_Man_t *p,int i)

{
  int iVar1;
  uint uVar2;
  
  if ((~(uint)p->pReprs[i] & 0xfffffff) == 0) {
    uVar2 = p->pNexts[i];
    if (0 < (int)uVar2) {
      iVar1 = 1;
      do {
        if (((uint)p->pReprs[uVar2] & 0xfffffff) != i) {
          __assert_fail("Gia_ObjRepr(p, Ent) == i",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEquiv.c"
                        ,0x1c2,"int Gia_ManEquivCountOne(Gia_Man_t *, int)");
        }
        iVar1 = iVar1 + 1;
        uVar2 = p->pNexts[uVar2];
      } while (0 < (int)uVar2);
      return iVar1;
    }
  }
  __assert_fail("Gia_ObjIsHead(p, i)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaEquiv.c"
                ,0x1c0,"int Gia_ManEquivCountOne(Gia_Man_t *, int)");
}

Assistant:

int Gia_ManEquivCountOne( Gia_Man_t * p, int i )
{
    int Ent, nLits = 1;
    Gia_ClassForEachObj1( p, i, Ent )
    {
        assert( Gia_ObjRepr(p, Ent) == i );
        nLits++;
    }
    return nLits;
}